

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
SmallDenseSet<TypePair,_TypePairHasher,_4U>::SmallDenseSet
          (SmallDenseSet<TypePair,_TypePairHasher,_4U> *this,Allocator *allocator)

{
  this->storage[3].a = (TypeBase *)0x0;
  this->storage[3].b = (TypeBase *)0x0;
  this->storage[2].a = (TypeBase *)0x0;
  this->storage[2].b = (TypeBase *)0x0;
  this->storage[1].a = (TypeBase *)0x0;
  this->storage[1].b = (TypeBase *)0x0;
  this->storage[0].a = (TypeBase *)0x0;
  this->storage[0].b = (TypeBase *)0x0;
  this->allocator = allocator;
  this->bucketCount = 4;
  this->count = 0;
  this->data = this->storage;
  NULLC::fillMemory(this->storage,0,0x40);
  return;
}

Assistant:

SmallDenseSet(Allocator *allocator = 0): allocator(allocator)
	{
		assert(N >= 2 && "size is too small");
		assert((N & (N - 1)) == 0 && "only power of 2 sizes are supported");

		bucketCount = N;

		count = 0;

		data = storage;

		NULLC::fillMemory(data, 0, sizeof(Key) * bucketCount);
	}